

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeDoubleConstant(Builder *this,double d,bool specConstant)

{
  Op OVar1;
  Id typeId;
  Id IVar2;
  Instruction *this_00;
  pointer *__ptr;
  undefined7 in_register_00000031;
  uint v1;
  uint v2;
  bool bVar3;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  double local_40;
  Instruction *c;
  
  local_40 = d;
  typeId = makeFloatType(this,0x40);
  bVar3 = (int)CONCAT71(in_register_00000031,specConstant) != 0;
  OVar1 = OpConstant;
  if (bVar3) {
    OVar1 = OpSpecConstant;
  }
  v2 = (uint)((ulong)local_40 >> 0x20);
  v1 = SUB84(local_40,0);
  if ((!bVar3) && (IVar2 = findScalarConstant(this,OpTypeFloat,OpConstant,typeId,v1,v2), IVar2 != 0)
     ) {
    return IVar2;
  }
  this_00 = (Instruction *)dxil_spv::allocate_in_thread(0x38);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  this_00->resultId = IVar2;
  this_00->typeId = typeId;
  this_00->opCode = OVar1;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  c = this_00;
  Instruction::addImmediateOperand(this_00,v1);
  Instruction::addImmediateOperand(this_00,v2);
  local_48._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedConstants + 0x16,&c);
  Module::mapInstruction(&this->module,c);
  return c->resultId;
}

Assistant:

Id Builder::makeDoubleConstant(double d, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(64);
    union { double db; unsigned long long ull; } u;
    u.db = d;
    unsigned long long value = u.ull;
    unsigned op1 = value & 0xFFFFFFFF;
    unsigned op2 = value >> 32;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, op1, op2);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(op1);
    c->addImmediateOperand(op2);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}